

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O1

void __thiscall
Rml::FilterDropShadow::ExtendInkOverflow
          (FilterDropShadow *this,Element *element,Rectanglef *scissor_region)

{
  Vector2f VVar1;
  Vector2f VVar2;
  Vector2Type VVar3;
  Vector2Type VVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = Element::ResolveLength(element,this->value_sigma);
  fVar6 = Element::ResolveLength(element,this->value_offset_x);
  fVar7 = Element::ResolveLength(element,this->value_offset_y);
  fVar5 = fVar5 * 3.0;
  VVar1 = Math::Max<Rml::Vector2<float>>
                    ((Vector2f)(CONCAT44(fVar7,fVar6) ^ 0x8000000080000000),(Vector2f)0x0);
  VVar2.y = fVar7;
  VVar2.x = fVar6;
  VVar2 = Math::Max<Rml::Vector2<float>>(VVar2,(Vector2f)0x0);
  fVar6 = (scissor_region->p1).y;
  VVar4.y = (scissor_region->p0).y - (VVar1.y + fVar5);
  VVar4.x = (scissor_region->p0).x - (fVar5 + VVar1.x);
  scissor_region->p0 = VVar4;
  VVar3.y = VVar2.y + fVar5 + fVar6;
  VVar3.x = fVar5 + VVar2.x + (scissor_region->p1).x;
  scissor_region->p1 = VVar3;
  return;
}

Assistant:

void FilterDropShadow::ExtendInkOverflow(Element* element, Rectanglef& scissor_region) const
{
	// Expand the ink overflow area to cover both the native element *and* its offset shadow w/blur.
	const float sigma = element->ResolveLength(value_sigma);
	const Vector2f offset = {
		element->ResolveLength(value_offset_x),
		element->ResolveLength(value_offset_y),
	};

	const float blur_extent = 3.f * sigma;
	scissor_region =
		scissor_region.Extend(Math::Max(-offset, Vector2f(0.f)) + Vector2f(blur_extent), Math::Max(offset, Vector2f(0.f)) + Vector2f(blur_extent));
}